

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void disas_bfext_reg(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *s_00;
  TCGv_i32 ret;
  uint32_t uVar1;
  TCGTemp *a2;
  TCGTemp *a1;
  uintptr_t o_1;
  uint uVar2;
  uint uVar3;
  uint arg2;
  uintptr_t o_5;
  TCGv_i32 pTVar4;
  uintptr_t o_6;
  TCGv_i32 ret_00;
  
  s_00 = s->uc->tcg_ctx;
  uVar1 = cpu_lduw_code_m68k(env,s->pc);
  s->pc = s->pc + 2;
  pTVar4 = s_00->cpu_dregs[insn & 7];
  ret = *(TCGv_i32 *)((long)s_00->cpu_dregs + (ulong)(uVar1 >> 9 & 0x38));
  uVar2 = uVar1 >> 6;
  arg2 = uVar2 & 0x1f;
  a2 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)a2 - (long)s_00);
  if ((uVar1 & 0x20) != 0) {
    if ((uVar1 >> 0xb & 1) == 0) {
      tcg_gen_rotli_i32_m68k(s_00,ret_00,pTVar4,arg2);
    }
    else {
      tcg_gen_andi_i32_m68k(s_00,ret_00,s_00->cpu_dregs[uVar2 & 7],0x1f);
      tcg_gen_rotl_i32_m68k(s_00,ret_00,pTVar4,ret_00);
    }
    a1 = tcg_temp_new_internal_m68k(s_00,TCG_TYPE_I32,false);
    pTVar4 = (TCGv_i32)((long)a1 - (long)s_00);
    tcg_gen_op2_m68k(s_00,INDEX_op_neg_i32,(TCGArg)a1,
                     (TCGArg)((long)&s_00->pool_cur + (long)s_00->cpu_dregs[uVar1 & 7]));
    tcg_gen_andi_i32_m68k(s_00,pTVar4,pTVar4,0x1f);
    tcg_gen_op3_m68k(s_00,INDEX_op_sar_i32,(TCGArg)(QREG_CC_N + (long)s_00),(TCGArg)a2,(TCGArg)a1);
    if ((insn >> 9 & 1) == 0) {
      tcg_gen_op3_m68k(s_00,INDEX_op_shr_i32,(TCGArg)(ret + (long)s_00),(TCGArg)a2,(TCGArg)a1);
    }
    else if (ret != QREG_CC_N) {
      tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)(ret + (long)s_00),
                       (TCGArg)(QREG_CC_N + (long)s_00));
    }
    tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(pTVar4 + (long)s_00));
    goto LAB_006fe337;
  }
  uVar3 = uVar1 - 1 & 0x1f;
  if ((uVar1 >> 0xb & 1) == 0) {
    uVar2 = uVar3 + 1 + arg2;
    if (0x20 < uVar2) {
      tcg_gen_rotli_i32_m68k(s_00,ret_00,pTVar4,arg2);
      goto LAB_006fe1d6;
    }
    uVar2 = 0x20 - uVar2;
  }
  else {
    tcg_gen_andi_i32_m68k(s_00,ret_00,s_00->cpu_dregs[uVar2 & 7],0x1f);
    tcg_gen_rotl_i32_m68k(s_00,ret_00,pTVar4,ret_00);
LAB_006fe1d6:
    uVar2 = uVar3 ^ 0x1f;
    pTVar4 = ret_00;
  }
  tcg_gen_sextract_i32_m68k(s_00,QREG_CC_N,pTVar4,uVar2,uVar3 + 1);
  if ((insn >> 9 & 1) == 0) {
    tcg_gen_extract_i32_m68k(s_00,ret,pTVar4,uVar2,uVar3 + 1);
  }
  else if (ret != QREG_CC_N) {
    tcg_gen_op2_m68k(s_00,INDEX_op_mov_i32,(TCGArg)(ret + (long)s_00),
                     (TCGArg)(QREG_CC_N + (long)s_00));
  }
LAB_006fe337:
  tcg_temp_free_internal_m68k(s_00,(TCGTemp *)(ret_00 + (long)s_00));
  set_cc_op(s,CC_OP_LOGIC);
  return;
}

Assistant:

DISAS_INSN(bfext_reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int ext = read_im16(env, s);
    int is_sign = insn & 0x200;
    TCGv src = DREG(insn, 0);
    TCGv dst = DREG(ext, 12);
    int len = ((extract32(ext, 0, 5) - 1) & 31) + 1;
    int ofs = extract32(ext, 6, 5);  /* big bit-endian */
    int pos = 32 - ofs - len;        /* little bit-endian */
    TCGv tmp = tcg_temp_new(tcg_ctx);
    TCGv shift;

    /*
     * In general, we're going to rotate the field so that it's at the
     * top of the word and then right-shift by the complement of the
     * width to extend the field.
     */
    if (ext & 0x20) {
        /* Variable width.  */
        if (ext & 0x800) {
            /* Variable offset.  */
            tcg_gen_andi_i32(tcg_ctx, tmp, DREG(ext, 6), 31);
            tcg_gen_rotl_i32(tcg_ctx, tmp, src, tmp);
        } else {
            tcg_gen_rotli_i32(tcg_ctx, tmp, src, ofs);
        }

        shift = tcg_temp_new(tcg_ctx);
        tcg_gen_neg_i32(tcg_ctx, shift, DREG(ext, 0));
        tcg_gen_andi_i32(tcg_ctx, shift, shift, 31);
        tcg_gen_sar_i32(tcg_ctx, QREG_CC_N, tmp, shift);
        if (is_sign) {
            tcg_gen_mov_i32(tcg_ctx, dst, QREG_CC_N);
        } else {
            tcg_gen_shr_i32(tcg_ctx, dst, tmp, shift);
        }
        tcg_temp_free(tcg_ctx, shift);
    } else {
        /* Immediate width.  */
        if (ext & 0x800) {
            /* Variable offset */
            tcg_gen_andi_i32(tcg_ctx, tmp, DREG(ext, 6), 31);
            tcg_gen_rotl_i32(tcg_ctx, tmp, src, tmp);
            src = tmp;
            pos = 32 - len;
        } else {
            /*
             * Immediate offset.  If the field doesn't wrap around the
             * end of the word, rely on (s)extract completely.
             */
            if (pos < 0) {
                tcg_gen_rotli_i32(tcg_ctx, tmp, src, ofs);
                src = tmp;
                pos = 32 - len;
            }
        }

        tcg_gen_sextract_i32(tcg_ctx, QREG_CC_N, src, pos, len);
        if (is_sign) {
            tcg_gen_mov_i32(tcg_ctx, dst, QREG_CC_N);
        } else {
            tcg_gen_extract_i32(tcg_ctx, dst, src, pos, len);
        }
    }

    tcg_temp_free(tcg_ctx, tmp);
    set_cc_op(s, CC_OP_LOGIC);
}